

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::AddVarint(UnknownFieldSet *this,int number,uint64 value)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *this_00;
  undefined1 local_30 [8];
  UnknownField field;
  uint64 value_local;
  int number_local;
  UnknownFieldSet *this_local;
  
  field.field_2.varint_ = value;
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    this_00 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               *)operator_new(0x18);
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    vector(this_00);
    this->fields_ = this_00;
  }
  local_30._0_4_ = number & 0x1fffffff;
  field._0_8_ = field.field_2;
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(this->fields_,(value_type *)local_30);
  return;
}

Assistant:

void UnknownFieldSet::AddVarint(int number, uint64 value) {
  if (fields_ == NULL) fields_ = new vector<UnknownField>;
  UnknownField field;
  field.number_ = number;
  field.type_ = UnknownField::TYPE_VARINT;
  field.varint_ = value;
  fields_->push_back(field);
}